

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O1

int E_IntLoop(int n1,int n2,int type,int type_2,int si1,int sj1,int sp1,int sq1,vrna_param_t *P)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int (*paiVar4) [5];
  int (*paaiVar5) [5] [5];
  int iVar6;
  int iVar7;
  double dVar8;
  
  iVar7 = n2;
  if (n2 < n1) {
    iVar7 = n1;
  }
  iVar3 = n2;
  if (n1 < n2) {
    iVar3 = n1;
  }
  if (iVar7 == 0) {
    return P->stack[type][type_2];
  }
  if (iVar3 == 2) {
    if (iVar7 == 3) {
      return P->ninio[2] + P->internal_loop[5] + P->mismatch23I[type][si1][sj1] +
             P->mismatch23I[type_2][sq1][sp1];
    }
    if (iVar7 == 2) {
      return P->int22[type][type_2][si1][sp1][sq1][sj1];
    }
  }
  else {
    if (iVar3 == 1) {
      if (iVar7 == 2) {
        iVar7 = sq1;
        iVar3 = type_2;
        if (n1 == 1) {
          sp1 = sj1;
          iVar7 = si1;
          iVar3 = type;
          type = type_2;
          si1 = sq1;
        }
        return P->int21[iVar3][type][iVar7][si1][sp1];
      }
      if (iVar7 == 1) {
        return P->int11[type][type_2][si1][sj1];
      }
      if (iVar7 < 0x1e) {
        iVar2 = P->internal_loop[iVar7 + 1];
      }
      else {
        iVar2 = P->internal_loop[0x1e];
        dVar1 = P->lxc;
        dVar8 = log((double)(iVar7 + 1) / 30.0);
        iVar2 = (int)(dVar8 * dVar1) + iVar2;
      }
      iVar7 = (iVar7 + -1) * P->ninio[2];
      if (MAX_NINIO < iVar7) {
        iVar7 = MAX_NINIO;
      }
      paiVar4 = P->mismatch1nI[type] + si1;
      paaiVar5 = P->mismatch1nI + type_2;
      goto LAB_0011322b;
    }
    if (iVar3 == 0) {
      if (iVar7 < 0x1f) {
        iVar3 = P->bulge[iVar7];
      }
      else {
        iVar3 = P->bulge[0x1e];
        dVar1 = P->lxc;
        dVar8 = log((double)iVar7 / 30.0);
        iVar3 = (int)(dVar8 * dVar1) + iVar3;
      }
      if (iVar7 == 1) {
        return iVar3 + P->stack[type][type_2];
      }
      if (2 < type) {
        iVar3 = iVar3 + P->TerminalAU;
      }
      if (type_2 < 3) {
        return iVar3;
      }
      return iVar3 + P->TerminalAU;
    }
  }
  iVar6 = n2 + n1;
  if (iVar6 < 0x1f) {
    iVar2 = P->internal_loop[iVar6];
  }
  else {
    iVar2 = P->internal_loop[0x1e];
    dVar1 = P->lxc;
    dVar8 = log((double)iVar6 / 30.0);
    iVar2 = (int)(dVar8 * dVar1) + iVar2;
  }
  iVar7 = (iVar7 - iVar3) * P->ninio[2];
  if (MAX_NINIO < iVar7) {
    iVar7 = MAX_NINIO;
  }
  paiVar4 = P->mismatchI[type] + si1;
  paaiVar5 = P->mismatchI + type_2;
LAB_0011322b:
  return iVar2 + (*paiVar4)[sj1] + iVar7 + (*paaiVar5)[sq1][sp1];
}

Assistant:

PRIVATE INLINE int
E_IntLoop(int           n1,
          int           n2,
          int           type,
          int           type_2,
          int           si1,
          int           sj1,
          int           sp1,
          int           sq1,
          vrna_param_t  *P)
{
  /* compute energy of degree 2 loop (stack bulge or interior) */
  int nl, ns, u, energy;

  energy = INF;

  if (n1 > n2) {
    nl  = n1;
    ns  = n2;
  } else {
    nl  = n2;
    ns  = n1;
  }

  if (nl == 0)
    return P->stack[type][type_2];  /* stack */

  if (ns == 0) {
    /* bulge */
    energy = (nl <= MAXLOOP) ? P->bulge[nl] :
             (P->bulge[30] + (int)(P->lxc * log(nl / 30.)));
    if (nl == 1) {
      energy += P->stack[type][type_2];
    } else {
      if (type > 2)
        energy += P->TerminalAU;

      if (type_2 > 2)
        energy += P->TerminalAU;
    }

    return energy;
  } else {
    /* interior loop */
    if (ns == 1) {
      if (nl == 1)                    /* 1x1 loop */
        return P->int11[type][type_2][si1][sj1];

      if (nl == 2) {
        /* 2x1 loop */
        if (n1 == 1)
          energy = P->int21[type][type_2][si1][sq1][sj1];
        else
          energy = P->int21[type_2][type][sq1][si1][sp1];

        return energy;
      } else {
        /* 1xn loop */
        energy =
          (nl + 1 <=
           MAXLOOP) ? (P->internal_loop[nl + 1]) : (P->internal_loop[30] +
                                                    (int)(P->lxc * log((nl + 1) / 30.)));
        energy  += MIN2(MAX_NINIO, (nl - ns) * P->ninio[2]);
        energy  += P->mismatch1nI[type][si1][sj1] + P->mismatch1nI[type_2][sq1][sp1];
        return energy;
      }
    } else if (ns == 2) {
      if (nl == 2) {
        /* 2x2 loop */
        return P->int22[type][type_2][si1][sp1][sq1][sj1];
      } else if (nl == 3) {
        /* 2x3 loop */
        energy  = P->internal_loop[5] + P->ninio[2];
        energy  += P->mismatch23I[type][si1][sj1] + P->mismatch23I[type_2][sq1][sp1];
        return energy;
      }
    }

    {
      /* generic interior loop (no else here!)*/
      u       = nl + ns;
      energy  =
        (u <=
         MAXLOOP) ? (P->internal_loop[u]) : (P->internal_loop[30] + (int)(P->lxc * log((u) / 30.)));

      energy += MIN2(MAX_NINIO, (nl - ns) * P->ninio[2]);

      energy += P->mismatchI[type][si1][sj1] + P->mismatchI[type_2][sq1][sp1];
    }
  }

  return energy;
}